

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsFieldDescriptorSetFixedOrder
              (FmsFieldDescriptor fd,FmsFieldType field_type,FmsBasisType basis_type,FmsInt order)

{
  ulong uVar1;
  FmsComponent pFVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  _FmsFieldDescriptor_FixedOrder *p_Var7;
  FmsInt *pFVar8;
  FmsInt FVar9;
  ulong uVar10;
  long lVar11;
  FmsInt FVar12;
  long lVar13;
  undefined1 local_68 [16];
  ulong local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (fd == (FmsFieldDescriptor)0x0) {
    iVar6 = 1;
  }
  else {
    pFVar2 = fd->component;
    if (pFVar2 == (FmsComponent)0x0) {
      iVar6 = 2;
    }
    else {
      iVar6 = 3;
      if ((fd->descriptor).any == (void *)0x0) {
        if (field_type < (FMS_HDIV|FMS_DISCONTINUOUS)) {
          uVar10 = pFVar2->dim;
          switch(field_type) {
          case FMS_CONTINUOUS:
            if (order == 0) {
              return 4;
            }
            local_68._8_8_ = order - 1;
            local_68._0_8_ = 1;
            local_58 = (order - 2) * local_68._8_8_ >> 1;
            local_50 = local_68._8_8_ * local_68._8_8_;
            local_48._8_8_ = local_68._8_8_ * local_68._8_8_ * local_68._8_8_;
            local_48._0_8_ = ((order - 3) * local_58) / 3;
            local_38._8_8_ = ((order * 2 + -3) * local_58) / 3;
            local_38._0_8_ = local_68._8_8_ * local_58;
            break;
          default:
            local_68._8_8_ = order + 1;
            local_68._0_8_ = 1;
            local_58 = (order + 2) * local_68._8_8_ >> 1;
            local_50 = local_68._8_8_ * local_68._8_8_;
            local_48._8_8_ = local_68._8_8_ * local_68._8_8_ * local_68._8_8_;
            local_48._0_8_ = ((order + 3) * local_58) / 3;
            local_38._8_8_ = ((order * 2 + 3) * local_58) / 3;
            local_38._0_8_ = local_68._8_8_ * local_58;
            lVar11 = 0;
            do {
              if (*(ulong *)((long)FmsEntityDim + lVar11) < uVar10) {
                *(undefined8 *)(local_68 + lVar11) = 0;
              }
              lVar11 = lVar11 + 8;
            } while (lVar11 != 0x40);
            break;
          case FMS_HCURL:
            FmsFieldDescriptorSetFixedOrder_cold_1();
          case FMS_HDIV:
            uVar1 = order + 1;
            local_68 = (undefined1  [16])0x0;
            local_48 = (undefined1  [16])0x0;
            if (uVar10 == 2) {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar1;
              local_68 = auVar5 << 0x40;
              local_58 = uVar1 * order;
              uVar10 = order * 2;
            }
            else {
              local_58 = uVar1 * (order + 2) >> 1;
              local_48._8_8_ = uVar1 * order * uVar1 * 3;
              local_48._0_8_ = (order + 2) * uVar1 * order >> 1;
              uVar10 = uVar1;
            }
            local_50 = uVar10 * uVar1;
            local_38 = (undefined1  [16])0x0;
          }
          if (pFVar2->num_parts == 0) {
            FVar12 = 0;
          }
          else {
            pFVar8 = pFVar2->parts->num_entities;
            FVar9 = 0;
            FVar12 = 0;
            do {
              lVar13 = 0;
              lVar11 = 0;
              do {
                uVar10 = pFVar8[lVar11];
                uVar1 = (pFVar8 + lVar11)[1];
                uVar3 = *(ulong *)(local_68 + lVar11 * 8);
                uVar4 = *(ulong *)(local_68 + lVar11 * 8 + 8);
                FVar12 = FVar12 + (uVar3 & 0xffffffff) * (uVar10 & 0xffffffff) +
                         ((uVar10 >> 0x20) * (uVar3 & 0xffffffff) +
                          (uVar3 >> 0x20) * (uVar10 & 0xffffffff) << 0x20);
                lVar13 = lVar13 + (uVar4 & 0xffffffff) * (uVar1 & 0xffffffff) +
                         ((uVar1 >> 0x20) * (uVar4 & 0xffffffff) +
                          (uVar4 >> 0x20) * (uVar1 & 0xffffffff) << 0x20);
                lVar11 = lVar11 + 2;
              } while (lVar11 != 8);
              FVar12 = lVar13 + FVar12;
              FVar9 = FVar9 + 1;
              pFVar8 = pFVar8 + 0x1d;
            } while (FVar9 != pFVar2->num_parts);
          }
          p_Var7 = (_FmsFieldDescriptor_FixedOrder *)malloc(0x10);
          if (p_Var7 == (_FmsFieldDescriptor_FixedOrder *)0x0) {
            iVar6 = 6;
          }
          else {
            p_Var7->field_type = field_type;
            p_Var7->basis_type = basis_type;
            p_Var7->order = order;
            fd->descr_type = FMS_FIXED_ORDER;
            (fd->descriptor).fixed_order = p_Var7;
            fd->num_dofs = FVar12;
            iVar6 = 0;
          }
        }
        else {
          iVar6 = 5;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int FmsFieldDescriptorSetFixedOrder(FmsFieldDescriptor fd,
                                    FmsFieldType field_type,
                                    FmsBasisType basis_type, FmsInt order) {
  if (!fd) { E_RETURN(1); }
  FmsComponent comp = fd->component;
  if (!comp) { E_RETURN(2); }
  if (fd->descriptor.any != NULL) { E_RETURN(3); }
  FmsInt num_dofs = 0;
  // Count the number of dofs - based on component, field_type and order
  FmsInt ent_dofs[FMS_NUM_ENTITY_TYPES];
  const FmsInt dim = comp->dim;
  const FmsInt p = order;
  switch (field_type) {
  case FMS_CONTINUOUS: {
    const FmsInt pm1 = p-1, pm2 = p-2, pm3 = p-3;
    if (p <= 0) { E_RETURN(4); }
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pm1;
    ent_dofs[FMS_TRIANGLE] = (pm1*pm2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pm1*pm1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pm3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pm1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pm1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pm3))/3;
    break;
  }
  case FMS_DISCONTINUOUS:
  case FMS_DISCONTINUOUS_WEIGHTED: {
    const FmsInt pp1 = p+1, pp2 = p+2, pp3 = p+3;
    // if (p < 0) { E_RETURN(4); } // If we make FmsInt a signed type
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pp1;
    ent_dofs[FMS_TRIANGLE] = (pp1*pp2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pp3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pp1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pp1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pp3))/3;
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      if (FmsEntityDim[et] < dim) {
        ent_dofs[et] = 0;
      }
    }
    break;
  }
  case FMS_HCURL: {
    FmsAbortNotImplemented();
    break;
  }
  case FMS_HDIV: {
    const FmsInt pp1 = p + 1, pp2 = p + 2;
    ent_dofs[FMS_VERTEX] = 0;
    ent_dofs[FMS_EDGE] = 0;
    ent_dofs[FMS_TETRAHEDRON] = 0;
    ent_dofs[FMS_HEXAHEDRON] = 0;
    if(dim == 2) {
      ent_dofs[FMS_EDGE] = pp1;
      ent_dofs[FMS_TRIANGLE] = p*pp1;
      ent_dofs[FMS_QUADRILATERAL] = 2*p*pp1;
    } else {
      ent_dofs[FMS_TRIANGLE] = pp1*pp2/2;
      ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
      ent_dofs[FMS_TETRAHEDRON] = p*pp1*(p + 2)/2;
      ent_dofs[FMS_HEXAHEDRON] = 3*p*pp1*pp1;
    }
    ent_dofs[FMS_WEDGE] = 0;
    ent_dofs[FMS_PYRAMID] = 0;
    break;
  }
  default: E_RETURN(5);
  }
  // Count the dofs part by part
  for (FmsInt i = 0; i < comp->num_parts; i++) {
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      num_dofs += comp->parts[i].num_entities[et] * ent_dofs[et];
    }
  }

  // Construct fixed-order descriptor
  struct _FmsFieldDescriptor_FixedOrder *fo;
  fo = malloc(sizeof(*fo));
  if (fo == NULL) { E_RETURN(6); }
  fo->field_type = field_type;
  fo->basis_type = basis_type;
  fo->order = order;
  // Update fd
  fd->descr_type = FMS_FIXED_ORDER;
  fd->descriptor.fixed_order = fo;
  fd->num_dofs = num_dofs;
  return 0;
}